

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O2

int asn1_template_ex_i2d
              (ASN1_VALUE **pval,uchar **out,ASN1_TEMPLATE *tt,int tag,int iclass,int optional)

{
  OPENSSL_STACK *sk;
  ASN1_ITEM *it;
  uchar **ppuVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint8_t *orig_ptr;
  void *pvVar7;
  long lVar8;
  ulong i;
  int iVar9;
  int *piVar10;
  uint xclass;
  ulong uVar11;
  bool bVar12;
  uint8_t *p;
  void *local_60;
  int local_54;
  uchar **local_50;
  uint local_44;
  ASN1_VALUE *skitem;
  ASN1_VALUE *local_38;
  
  if ((iclass & 0xffffff3fU) != 0) {
    __assert_fail("(iclass & ASN1_TFLG_TAG_CLASS) == iclass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0xf0,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  if (iclass != 0 && tag == -1) {
    __assert_fail("tag != -1 || iclass == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0xf2,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  uVar3 = tt->flags;
  if ((uVar3 & 0x18) == 0) {
    xclass = 0;
    if (tag != -1) {
      xclass = iclass;
    }
  }
  else {
    if (tag != -1) {
      ERR_put_error(0xc,0,0xc1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                    ,0xfa);
      return -1;
    }
    tag = tt->tag;
    xclass = uVar3 & 0xc0;
  }
  if (((byte)uVar3 & optional != 0) == 1) {
    __assert_fail("!optional || (flags & ASN1_TFLG_OPTIONAL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x10d,
                  "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                 );
  }
  uVar2 = (uint)(optional != 0 || (uVar3 & 1) != 0);
  if ((uVar3 & 6) == 0) {
    if ((uVar3 & 0x10) == 0) {
      iVar9 = asn1_item_ex_i2d_opt(pval,out,tt->item,tag,xclass,uVar2);
      return iVar9;
    }
    uVar3 = asn1_item_ex_i2d_opt(pval,(uchar **)0x0,tt->item,-1,0,uVar2);
    uVar4 = uVar3;
    if (((0 < (int)uVar3) && (uVar4 = ASN1_object_size(1,uVar3,tag), out != (uchar **)0x0)) &&
       (uVar4 != 0xffffffff)) {
      ASN1_put_object(out,1,uVar3,tag,xclass);
      iVar9 = ASN1_item_ex_i2d((ASN1_VALUE **)pval,out,(ASN1_ITEM *)tt->item,-1,0);
      if (iVar9 < 0) {
        return -1;
      }
    }
  }
  else {
    sk = (OPENSSL_STACK *)*pval;
    if (sk == (OPENSSL_STACK *)0x0) {
      uVar4 = 0;
      if (uVar2 == 0) {
        ERR_put_error(0xc,0,0x9b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                      ,0x11e);
        uVar4 = 0xffffffff;
      }
    }
    else {
      local_50 = out;
      if ((uVar3 & 2) == 0) {
        iVar9 = 0x10;
      }
      else {
        if ((uVar3 & 4) != 0) {
          __assert_fail("(flags & ASN1_TFLG_SEQUENCE_OF) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                        ,0x126,
                        "int asn1_template_ex_i2d(ASN1_VALUE **, unsigned char **, const ASN1_TEMPLATE *, int, int, int)"
                       );
        }
        iVar9 = 0x11;
      }
      bVar12 = (uVar3 & 0x10) == 0;
      uVar11 = 0;
      if (tag != -1 && bVar12) {
        iVar9 = tag;
      }
      local_60 = (void *)CONCAT44(local_60._4_4_,iVar9);
      local_44 = 0;
      if (tag != -1 && bVar12) {
        local_44 = xclass;
      }
      iVar9 = 0;
      local_54 = tag;
      for (; sVar6 = OPENSSL_sk_num(sk), uVar11 < sVar6; uVar11 = uVar11 + 1) {
        skitem = (ASN1_VALUE *)OPENSSL_sk_value(sk,uVar11);
        uVar2 = ASN1_item_ex_i2d((ASN1_VALUE **)&skitem,(uchar **)0x0,(ASN1_ITEM *)tt->item,-1,0);
        if (uVar2 == 0xffffffff) {
          return -1;
        }
        if ((int)(uVar2 ^ 0x7fffffff) < iVar9) {
          return -1;
        }
        iVar9 = iVar9 + uVar2;
      }
      uVar2 = ASN1_object_size(1,iVar9,(int)local_60);
      ppuVar1 = local_50;
      uVar4 = 0xffffffff;
      if (uVar2 != 0xffffffff) {
        if ((uVar3 & 0x10) == 0) {
          uVar4 = uVar2;
          if (local_50 == (uchar **)0x0) {
            return uVar2;
          }
        }
        else {
          uVar4 = ASN1_object_size(1,uVar2,local_54);
          if (ppuVar1 == (uchar **)0x0) {
            return uVar4;
          }
          if (uVar4 == 0xffffffff) {
            return -1;
          }
          ASN1_put_object(ppuVar1,1,uVar2,local_54,xclass);
        }
        ASN1_put_object(ppuVar1,1,iVar9,(int)local_60,local_44);
        it = (ASN1_ITEM *)tt->item;
        if (((uVar3 & 2) == 0) || (sVar6 = OPENSSL_sk_num(sk), sVar6 < 2)) {
          uVar11 = 0;
          do {
            i = uVar11;
            sVar6 = OPENSSL_sk_num(sk);
            if (sVar6 <= i) break;
            p = (uint8_t *)OPENSSL_sk_value(sk,i);
            iVar9 = ASN1_item_ex_i2d((ASN1_VALUE **)&p,local_50,it,-1,0);
            uVar11 = i + 1;
          } while (-1 < iVar9);
          bVar12 = sVar6 <= i;
        }
        else {
          orig_ptr = (uint8_t *)OPENSSL_malloc((long)iVar9);
          sVar6 = OPENSSL_sk_num(sk);
          pvVar7 = OPENSSL_calloc(sVar6,0x10);
          bVar12 = false;
          p = orig_ptr;
          if ((pvVar7 != (void *)0x0) && (orig_ptr != (uint8_t *)0x0)) {
            piVar10 = (int *)((long)pvVar7 + 8);
            local_60 = pvVar7;
            for (uVar11 = 0; sVar6 = OPENSSL_sk_num(sk), uVar11 < sVar6; uVar11 = uVar11 + 1) {
              local_38 = (ASN1_VALUE *)OPENSSL_sk_value(sk,uVar11);
              *(uint8_t **)(piVar10 + -2) = p;
              iVar5 = ASN1_item_ex_i2d(&local_38,&p,it,-1,0);
              *piVar10 = iVar5;
              if (iVar5 < 0) {
                bVar12 = false;
                pvVar7 = local_60;
                goto LAB_001f4774;
              }
              if ((long)iVar9 < (long)p - (long)orig_ptr) {
                __assert_fail("p - buf <= skcontlen",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                              ,0x1b0,
                              "int asn1_set_seq_out(struct stack_st_ASN1_VALUE *, unsigned char **, int, const ASN1_ITEM *, int)"
                             );
              }
              piVar10 = piVar10 + 4;
            }
            sVar6 = OPENSSL_sk_num(sk);
            pvVar7 = local_60;
            qsort(local_60,sVar6,0x10,der_cmp);
            ppuVar1 = local_50;
            p = *local_50;
            piVar10 = (int *)((long)pvVar7 + 8);
            for (uVar11 = 0; sVar6 = OPENSSL_sk_num(sk), uVar11 < sVar6; uVar11 = uVar11 + 1) {
              if ((long)*piVar10 == 0) {
                lVar8 = 0;
              }
              else {
                memcpy(p,*(void **)(piVar10 + -2),(long)*piVar10);
                lVar8 = (long)*piVar10;
              }
              p = p + lVar8;
              piVar10 = piVar10 + 4;
            }
            *ppuVar1 = p;
            bVar12 = true;
            pvVar7 = local_60;
          }
LAB_001f4774:
          OPENSSL_free(pvVar7);
          OPENSSL_free(orig_ptr);
        }
        uVar4 = -(uint)!bVar12 | uVar4;
      }
    }
  }
  return uVar4;
}

Assistant:

static int asn1_template_ex_i2d(ASN1_VALUE **pval, unsigned char **out,
                                const ASN1_TEMPLATE *tt, int tag, int iclass,
                                int optional) {
  int i, ret, ttag, tclass;
  size_t j;
  uint32_t flags = tt->flags;

  // Historically, |iclass| was repurposed to pass additional flags into the
  // encoding process.
  assert((iclass & ASN1_TFLG_TAG_CLASS) == iclass);
  // If not overridding the tag, |iclass| is ignored and should be zero.
  assert(tag != -1 || iclass == 0);

  // Work out tag and class to use: tagging may come either from the
  // template or the arguments, not both because this would create
  // ambiguity.
  if (flags & ASN1_TFLG_TAG_MASK) {
    // Error if argument and template tagging
    if (tag != -1) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
      return -1;
    }
    // Get tagging from template
    ttag = tt->tag;
    tclass = flags & ASN1_TFLG_TAG_CLASS;
  } else if (tag != -1) {
    // No template tagging, get from arguments
    ttag = tag;
    tclass = iclass & ASN1_TFLG_TAG_CLASS;
  } else {
    ttag = -1;
    tclass = 0;
  }

  // The template may itself by marked as optional, or this may be the template
  // of an |ASN1_ITEM_TEMPLATE| type which was contained inside an outer
  // optional template. (They cannot both be true because the
  // |ASN1_ITEM_TEMPLATE| codepath rejects optional templates.)
  assert(!optional || (flags & ASN1_TFLG_OPTIONAL) == 0);
  optional = optional || (flags & ASN1_TFLG_OPTIONAL) != 0;

  // At this point 'ttag' contains the outer tag to use, and 'tclass' is the
  // class.

  if (flags & ASN1_TFLG_SK_MASK) {
    // SET OF, SEQUENCE OF
    STACK_OF(ASN1_VALUE) *sk = (STACK_OF(ASN1_VALUE) *)*pval;
    int isset, sktag, skaclass;
    int skcontlen, sklen;
    ASN1_VALUE *skitem;

    if (!*pval) {
      if (optional) {
        return 0;
      }
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
      return -1;
    }

    if (flags & ASN1_TFLG_SET_OF) {
      isset = 1;
      // Historically, types with both bits set were mutated when
      // serialized to apply the sort. We no longer support this.
      assert((flags & ASN1_TFLG_SEQUENCE_OF) == 0);
    } else {
      isset = 0;
    }

    // Work out inner tag value: if EXPLICIT or no tagging use underlying
    // type.
    if ((ttag != -1) && !(flags & ASN1_TFLG_EXPTAG)) {
      sktag = ttag;
      skaclass = tclass;
    } else {
      skaclass = V_ASN1_UNIVERSAL;
      if (isset) {
        sktag = V_ASN1_SET;
      } else {
        sktag = V_ASN1_SEQUENCE;
      }
    }

    // Determine total length of items
    skcontlen = 0;
    for (j = 0; j < sk_ASN1_VALUE_num(sk); j++) {
      int tmplen;
      skitem = sk_ASN1_VALUE_value(sk, j);
      tmplen = ASN1_item_ex_i2d(&skitem, NULL, ASN1_ITEM_ptr(tt->item), -1, 0);
      if (tmplen == -1 || (skcontlen > INT_MAX - tmplen)) {
        return -1;
      }
      skcontlen += tmplen;
    }
    sklen = ASN1_object_size(/*constructed=*/1, skcontlen, sktag);
    if (sklen == -1) {
      return -1;
    }
    // If EXPLICIT need length of surrounding tag
    if (flags & ASN1_TFLG_EXPTAG) {
      ret = ASN1_object_size(/*constructed=*/1, sklen, ttag);
    } else {
      ret = sklen;
    }

    if (!out || ret == -1) {
      return ret;
    }

    // Now encode this lot...
    // EXPLICIT tag
    if (flags & ASN1_TFLG_EXPTAG) {
      ASN1_put_object(out, /*constructed=*/1, sklen, ttag, tclass);
    }
    // SET or SEQUENCE and IMPLICIT tag
    ASN1_put_object(out, /*constructed=*/1, skcontlen, sktag, skaclass);
    // And the stuff itself
    if (!asn1_set_seq_out(sk, out, skcontlen, ASN1_ITEM_ptr(tt->item), isset)) {
      return -1;
    }
    return ret;
  }

  if (flags & ASN1_TFLG_EXPTAG) {
    // EXPLICIT tagging
    // Find length of tagged item
    i = asn1_item_ex_i2d_opt(pval, NULL, ASN1_ITEM_ptr(tt->item), -1, 0,
                             optional);
    if (i <= 0) {
      return i;
    }
    // Find length of EXPLICIT tag
    ret = ASN1_object_size(/*constructed=*/1, i, ttag);
    if (out && ret != -1) {
      // Output tag and item
      ASN1_put_object(out, /*constructed=*/1, i, ttag, tclass);
      if (ASN1_item_ex_i2d(pval, out, ASN1_ITEM_ptr(tt->item), -1, 0) < 0) {
        return -1;
      }
    }
    return ret;
  }

  // Either normal or IMPLICIT tagging
  return asn1_item_ex_i2d_opt(pval, out, ASN1_ITEM_ptr(tt->item), ttag, tclass,
                              optional);
}